

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O3

int archive_random(void *buf,size_t nbytes)

{
  uint8_t uVar1;
  uint8_t uVar2;
  __pid_t _Var3;
  int iVar4;
  u_char *buf_1;
  byte bVar5;
  
  _Var3 = getpid();
  if (((arc4_count < 1) || ((rs_initialized & 1) == 0)) || (arc4_stir_pid != _Var3)) {
    arc4_stir_pid = _Var3;
    arc4_stir();
  }
  iVar4 = arc4_count;
  if (nbytes != 0) {
    do {
      arc4_count = iVar4 + -1;
      if (iVar4 < 2) {
        arc4_stir();
      }
      iVar4 = arc4_count;
      rs.i = rs.i + 1;
      uVar1 = rs.s[rs.i];
      bVar5 = rs.j + uVar1;
      uVar2 = rs.s[bVar5];
      rs.j = bVar5;
      rs.s[rs.i] = uVar2;
      rs.s[bVar5] = uVar1;
      *(uint8_t *)((long)buf + (nbytes - 1)) = rs.s[(byte)(uVar2 + uVar1)];
      nbytes = nbytes - 1;
    } while (nbytes != 0);
  }
  return 0;
}

Assistant:

int
archive_random(void *buf, size_t nbytes)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	HCRYPTPROV hProv;
	BOOL success;

	success = CryptAcquireContext(&hProv, NULL, NULL, PROV_RSA_FULL,
	    CRYPT_VERIFYCONTEXT);
	if (!success && GetLastError() == NTE_BAD_KEYSET) {
		success = CryptAcquireContext(&hProv, NULL, NULL,
		    PROV_RSA_FULL, CRYPT_NEWKEYSET);
	}
	if (success) {
		success = CryptGenRandom(hProv, (DWORD)nbytes, (BYTE*)buf);
		CryptReleaseContext(hProv, 0);
		if (success)
			return ARCHIVE_OK;
	}
	/* TODO: Does this case really happen? */
	return ARCHIVE_FAILED;
#else
	arc4random_buf(buf, nbytes);
	return ARCHIVE_OK;
#endif
}